

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void outlet_anything(_outlet *x,t_symbol *s,int argc,t_atom *argv)

{
  _outconnect *local_30;
  _outconnect *oc;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  _outlet *x_local;
  
  stackcount = stackcount + 1;
  if (stackcount < 1000) {
    for (local_30 = x->o_connections; local_30 != (_outconnect *)0x0; local_30 = local_30->oc_next)
    {
      pd_typedmess(local_30->oc_to,s,argc,argv);
    }
  }
  else {
    outlet_stackerror(x);
  }
  stackcount = stackcount + -1;
  return;
}

Assistant:

void outlet_anything(t_outlet *x, t_symbol *s, int argc, t_atom *argv)
{
    t_outconnect *oc;
    if(++stackcount >= STACKITER)
        outlet_stackerror(x);
    else
    for (oc = x->o_connections; oc; oc = oc->oc_next)
        typedmess(oc->oc_to, s, argc, argv);
    --stackcount;
}